

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O1

int MarkCacheHash(char *ptr,int modulus)

{
  int iVar1;
  int iVar2;
  
  iVar2 = *(int *)ptr * 0x3e5 + *(int *)(ptr + 8);
  iVar1 = -iVar2;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  return iVar1 % modulus;
}

Assistant:

static int
MarkCacheHash(
  const char * ptr,
  int  modulus)
{
    int val = 0;
    MarkCacheKey *entry;

    entry = (MarkCacheKey *) ptr;

    val = (int) (ptrint) entry->f;
    val = val * 997 + (int) (ptrint) entry->c;

    return ((val < 0) ? -val : val) % modulus;

}